

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O2

SuffixTreeInternalNode * __thiscall
wasm::SuffixTree::insertInternalNode
          (SuffixTree *this,SuffixTreeInternalNode *Parent,uint StartIdx,uint EndIdx,uint Edge)

{
  uint __line;
  SuffixTreeInternalNode *this_00;
  mapped_type *ppSVar1;
  char *__assertion;
  key_type local_34 [2];
  uint Edge_local;
  
  if (EndIdx < StartIdx) {
    __assertion = "StartIdx <= EndIdx && \"String can\'t start after it ends!\"";
    __line = 0x48;
  }
  else {
    if (Parent != (SuffixTreeInternalNode *)0x0 || StartIdx == 0xffffffff) {
      this_00 = llvm::
                AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::
                Allocate<wasm::SuffixTreeInternalNode>
                          ((AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                            *)&this->InternalNodeAllocator,1);
      SuffixTreeInternalNode::SuffixTreeInternalNode(this_00,StartIdx,EndIdx,this->Root);
      if (Parent != (SuffixTreeInternalNode *)0x0) {
        ppSVar1 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&Parent->Children,local_34);
        *ppSVar1 = &this_00->super_SuffixTreeNode;
      }
      return this_00;
    }
    __assertion = 
    "!(!Parent && StartIdx != SuffixTreeNode::EmptyIdx) && \"Non-root internal nodes must have parents!\""
    ;
    __line = 0x4a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/suffix_tree.cpp"
                ,__line,
                "SuffixTreeInternalNode *wasm::SuffixTree::insertInternalNode(SuffixTreeInternalNode *, unsigned int, unsigned int, unsigned int)"
               );
}

Assistant:

SuffixTreeInternalNode*
SuffixTree::insertInternalNode(SuffixTreeInternalNode* Parent,
                               unsigned StartIdx,
                               unsigned EndIdx,
                               unsigned Edge) {
  assert(StartIdx <= EndIdx && "String can't start after it ends!");
  assert(!(!Parent && StartIdx != SuffixTreeNode::EmptyIdx) &&
         "Non-root internal nodes must have parents!");
  auto* N = new (InternalNodeAllocator.Allocate())
    SuffixTreeInternalNode(StartIdx, EndIdx, Root);
  if (Parent) {
    Parent->Children[Edge] = N;
  }
  return N;
}